

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

void __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::updateBoundingBox
          (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,Node *node)

{
  bool bVar1;
  P *source;
  P *destination;
  P_set *this_00;
  int d;
  uint dim;
  P_less local_34;
  P_set local_33;
  P_less local_32;
  P_set local_31;
  
  dim = 0;
  do {
    if (dim == 3) {
      return;
    }
    bVar1 = P_less::operator()(&local_34,node->value,this->boundingBoxMin,dim);
    if (bVar1) {
      destination = this->boundingBoxMin;
      source = node->value;
      this_00 = &local_33;
LAB_00103f09:
      P_set::operator()(this_00,destination,source,dim);
    }
    else {
      bVar1 = P_less::operator()(&local_32,this->boundingBoxMax,node->value,dim);
      if (bVar1) {
        destination = this->boundingBoxMax;
        source = node->value;
        this_00 = &local_31;
        goto LAB_00103f09;
      }
    }
    dim = dim + 1;
  } while( true );
}

Assistant:

void updateBoundingBox(const Node * const node) {
			for (int d = 0; d < dim; d++) {
				if (LESS()(node->value, boundingBoxMin, d)) {
					SET()(boundingBoxMin, node->value, d);
				}
				else if (LESS()(boundingBoxMax, node->value, d)) {
					SET()(boundingBoxMax, node->value, d);
				}
			}
		}